

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O1

SQFuncState * __thiscall SQFuncState::PushChildState(SQFuncState *this,SQSharedState *ss)

{
  ulong uVar1;
  ulong uVar2;
  SQUnsignedInteger SVar3;
  SQFuncState *this_00;
  SQFuncState **ppSVar4;
  SQUnsignedInteger SVar5;
  
  this_00 = (SQFuncState *)sq_malloc(0x210);
  SQFuncState(this_00,ss,this,this->_errfunc,this->_errtarget);
  uVar1 = (this->_childstates)._size;
  uVar2 = (this->_childstates)._allocated;
  if (uVar2 <= uVar1) {
    SVar3 = uVar1 * 2;
    SVar5 = 4;
    if (SVar3 != 0) {
      SVar5 = SVar3;
    }
    ppSVar4 = (SQFuncState **)sq_vm_realloc((this->_childstates)._vals,uVar2 << 3,SVar5 * 8);
    (this->_childstates)._vals = ppSVar4;
    (this->_childstates)._allocated = SVar5;
  }
  SVar3 = (this->_childstates)._size;
  (this->_childstates)._size = SVar3 + 1;
  (this->_childstates)._vals[SVar3] = this_00;
  return this_00;
}

Assistant:

SQFuncState *SQFuncState::PushChildState(SQSharedState *ss)
{
    SQFuncState *child = (SQFuncState *)sq_malloc(sizeof(SQFuncState));
    new (child) SQFuncState(ss,this,_errfunc,_errtarget);
    _childstates.push_back(child);
    return child;
}